

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline::~RpcPipeline(RpcPipeline *this)

{
  RpcPipeline *this_local;
  
  kj::Promise<void>::~Promise(&this->resolveSelfPromise);
  kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~HashMap
            (&this->clientMap);
  kj::
  OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>,_kj::Exception>
  ::~OneOf(&this->state);
  kj::
  Maybe<kj::ForkedPromise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  ::~Maybe(&this->redirectLater);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::~Own(&this->connectionState)
  ;
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

RpcPipeline(RpcConnectionState& connectionState, kj::Own<QuestionRef>&& questionRef,
                kj::Promise<kj::Own<RpcResponse>>&& redirectLaterParam)
        : connectionState(kj::addRef(connectionState)),
          redirectLater(redirectLaterParam.fork()),
          resolveSelfPromise(KJ_ASSERT_NONNULL(redirectLater).addBranch().then(
              [this](kj::Own<RpcResponse>&& response) {
                resolve(kj::mv(response));
              }, [this](kj::Exception&& exception) {
                resolve(kj::mv(exception));
              }).eagerlyEvaluate([&](kj::Exception&& e) {
                // Make any exceptions thrown from resolve() go to the connection's TaskSet which
                // will cause the connection to be terminated.
                connectionState.tasks.add(kj::mv(e));
              })) {
      // Construct a new RpcPipeline.

      state.init<Waiting>(kj::mv(questionRef));
    }